

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O3

int mk_sched_launch_thread(mk_server *server,pthread_t *tout)

{
  pthread_mutex_t *__mutex;
  uint __errnum;
  int iVar1;
  undefined8 *__arg;
  uint *puVar2;
  char *pcVar3;
  pthread_t tid;
  pthread_attr_t attr;
  char buf [128];
  pthread_t local_f8;
  pthread_attr_t local_f0;
  char local_b8 [136];
  
  server->pth_init = 0;
  __mutex = &server->pth_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  __arg = (undefined8 *)calloc(1,8);
  *__arg = server;
  pthread_attr_init(&local_f0);
  pthread_attr_setdetachstate(&local_f0,0);
  iVar1 = pthread_create(&local_f8,&local_f0,mk_sched_launch_worker_loop,__arg);
  if (iVar1 == 0) {
    *tout = local_f8;
    iVar1 = 0;
    if (server->pth_init == 0) {
      do {
        pthread_cond_wait((pthread_cond_t *)&server->pth_cond,(pthread_mutex_t *)__mutex);
        iVar1 = 0;
      } while (server->pth_init == 0);
    }
  }
  else {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror_r(__errnum,local_b8,0x80);
    if (pcVar3 != (char *)0x0) {
      mk_print(0x1001,"strerror_r() failed");
    }
    mk_print(0x1001,"%s: %s, errno=%i at %s:%i","pthread_create",local_b8,(ulong)__errnum,
             "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
             ,0x1bd);
    iVar1 = -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return iVar1;
}

Assistant:

int mk_sched_launch_thread(struct mk_server *server, pthread_t *tout)
{
    pthread_t tid;
    pthread_attr_t attr;
    struct mk_sched_thread_conf *thconf;

    server->pth_init = MK_FALSE;

    /*
     * This lock is used for the 'pth_cond' conditional. Once the worker
     * thread is ready it will signal the condition.
     */
    pthread_mutex_lock(&server->pth_mutex);

    /* Thread data */
    thconf = mk_mem_alloc_z(sizeof(struct mk_sched_thread_conf));
    thconf->server = server;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(&tid, &attr, mk_sched_launch_worker_loop,
                       (void *) thconf) != 0) {
        mk_libc_error("pthread_create");
        pthread_mutex_unlock(&server->pth_mutex);
        return -1;
    }

    *tout = tid;

    /* Block until the child thread is ready */
    while (!server->pth_init) {
        pthread_cond_wait(&server->pth_cond, &server->pth_mutex);
    }

    pthread_mutex_unlock(&server->pth_mutex);

    return 0;
}